

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

void __thiscall OpenMD::Component::~Component(Component *this)

{
  ~Component(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

Component::~Component() {}